

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O1

void gen_xvnmaddsp(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *s;
  sbyte sVar2;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGTemp *ts_02;
  sbyte sVar3;
  bool bVar4;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  if (ctx->vsx_enabled == false) {
    gen_exception(ctx,0x5e);
    return;
  }
  s = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_ppc64
            (s,(TCGv_i64)((long)ts - (long)s),(TCGv_i64)s->cpu_env,
             (ulong)((uVar1 >> 0x15 & 0x1f | (uVar1 & 1) << 5) * 0x10 + 0x12b20));
  uVar1 = ctx->opcode;
  ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_ppc64
            (s,(TCGv_i64)((long)ts_00 - (long)s),(TCGv_i64)s->cpu_env,
             (ulong)(((uVar1 >> 0x10 & 0x1f) + (uVar1 & 4) * 8) * 0x10 + 0x12b20));
  uVar1 = ctx->opcode;
  ts_01 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  bVar4 = (uVar1 & 0x40) == 0;
  sVar3 = 0xb;
  sVar2 = 0x15;
  if (bVar4) {
    sVar2 = 0xb;
    sVar3 = 0x15;
  }
  tcg_gen_addi_i64_ppc64
            (s,(TCGv_i64)((long)ts_01 - (long)s),(TCGv_i64)s->cpu_env,
             (ulong)((uVar1 >> sVar2 & 0x1f | uVar1 << (bVar4 ^ 5U) & 0x20) * 0x10 + 0x12b20));
  uVar1 = ctx->opcode;
  ts_02 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_ppc64
            (s,(TCGv_i64)((long)ts_02 - (long)s),(TCGv_i64)s->cpu_env,
             (ulong)((uVar1 >> sVar3 & 0x1f | uVar1 << (bVar4 | 4U) & 0x20) * 0x10 + 0x12b20));
  local_58 = (TCGTemp *)(s->cpu_env + (long)s);
  local_50 = ts;
  local_48 = ts_00;
  local_40 = ts_01;
  local_38 = ts_02;
  tcg_gen_callN_ppc64(s,helper_xvnmaddsp,(TCGTemp *)0x0,5,&local_58);
  tcg_temp_free_internal_ppc64(s,ts);
  tcg_temp_free_internal_ppc64(s,ts_00);
  tcg_temp_free_internal_ppc64(s,ts_01);
  tcg_temp_free_internal_ppc64(s,ts_02);
  return;
}

Assistant:

static void gen_xxbrd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    TCGv_i64 xbh;
    TCGv_i64 xbl;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);
    xbh = tcg_temp_new_i64(tcg_ctx);
    xbl = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xbh, xB(ctx->opcode));
    get_cpu_vsrl(tcg_ctx, xbl, xB(ctx->opcode));

    tcg_gen_bswap64_i64(tcg_ctx, xth, xbh);
    tcg_gen_bswap64_i64(tcg_ctx, xtl, xbl);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), xtl);

    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
    tcg_temp_free_i64(tcg_ctx, xbh);
    tcg_temp_free_i64(tcg_ctx, xbl);
}